

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

int xlsxioread_sheet_next_cell_int(xlsxioreadersheet sheethandle,int64_t *pvalue)

{
  int iVar1;
  XML_Char *__ptr;
  int status;
  XML_Char *result;
  int64_t *pvalue_local;
  xlsxioreadersheet sheethandle_local;
  
  __ptr = xlsxioread_sheet_next_cell(sheethandle);
  if (__ptr == (XML_Char *)0x0) {
    sheethandle_local._4_4_ = 0;
  }
  else {
    if ((pvalue != (int64_t *)0x0) &&
       ((iVar1 = __isoc99_sscanf(__ptr,"%li",pvalue), iVar1 == -1 || (iVar1 == 0)))) {
      *pvalue = 0;
    }
    free(__ptr);
    sheethandle_local._4_4_ = 1;
  }
  return sheethandle_local._4_4_;
}

Assistant:

DLL_EXPORT_XLSXIO int xlsxioread_sheet_next_cell_int (xlsxioreadersheet sheethandle, int64_t* pvalue)
{
  XML_Char* result;
  int status;
  if ((result = xlsxioread_sheet_next_cell(sheethandle)) == NULL)
    return 0;
  if (pvalue) {
    status = XML_Char_sscanf(result, X("%" PRIi64), pvalue);
    if (status == EOF || status == 0)
      *pvalue = 0;
    //alternative: use strtoimax()
  }
  free(result);
  return 1;
}